

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O2

iter * __thiscall riffcpp::Chunk::iterator::operator++(iterator *this)

{
  streampos *psVar1;
  uint uVar2;
  impl *piVar3;
  __mbstate_t _Var4;
  FourCC FVar5;
  uint32_t uVar6;
  impl *this_00;
  undefined4 *puVar7;
  long lVar8;
  __shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_48;
  __shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_38;
  Chunk chunk;
  
  this_00 = (impl *)operator_new(0x48);
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->m_pos)._M_off = 0;
  (this_00->m_pos)._M_state.__count = 0;
  (this_00->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_limit)._M_off = 0;
  (this_00->m_limit)._M_state.__count = 0;
  (this_00->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  *(undefined8 *)(this_00->m_id)._M_elems = 0;
  std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)this_00,
            (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)this->pimpl);
  _Var4 = (this->pimpl->m_pos)._M_state;
  (this_00->m_pos)._M_off = (this->pimpl->m_pos)._M_off;
  (this_00->m_pos)._M_state = _Var4;
  std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,
               (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)this_00);
  FVar5 = read_id((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)&local_38,
                  this_00->m_pos);
  *&(this_00->m_id)._M_elems = FVar5._M_elems;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&_Stack_48,
               (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)this_00);
  uVar6 = read_size((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)&_Stack_48,
                    this_00->m_pos);
  this_00->m_size = uVar6;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  uVar2 = this_00->m_size;
  lVar8 = (this_00->m_pos)._M_off + (ulong)uVar2;
  piVar3 = this->pimpl;
  if (lVar8 <= (piVar3->m_limit)._M_off) {
    _Var4 = (this_00->m_pos)._M_state;
    (this_00->m_limit)._M_off = lVar8;
    (this_00->m_limit)._M_state = _Var4;
    psVar1 = &piVar3->m_pos;
    psVar1->_M_off = psVar1->_M_off + (ulong)(uVar2 + (uVar2 & 1) + 8);
    chunk.pimpl = this_00;
    ~Chunk(&chunk);
    return this;
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
  *puVar7 = 2;
  *(char **)(puVar7 + 2) = "Chunk size outside of range";
  __cxa_throw(puVar7,&Error::typeinfo,0);
}

Assistant:

iter &iter::operator++() {
  auto im = new riffcpp::Chunk::impl();
  im->m_stream = pimpl->m_stream;
  im->m_pos = pimpl->m_pos;

  im->m_id = read_id(im->m_stream, im->m_pos);
  im->m_size = read_size(im->m_stream, im->m_pos);

  auto limit = im->m_pos + std::streamoff{im->m_size};

  if (limit > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
  im->m_limit = limit;

  riffcpp::Chunk chunk{im};
  std::uint32_t sz = chunk.size();
  std::streamoff offs{sz + sz % 2 + 8};

  pimpl->m_pos += offs;
  return *this;
}